

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# explore_internal.h
# Opt level: O0

int exploration::generate_epsilon_greedy<ACTION_SCORE::score_iterator>
              (float param_1,uint param_2,score_iterator *param_3,score_iterator *param_4)

{
  bool bVar1;
  float *pfVar2;
  float fVar3;
  score_iterator d;
  float prob;
  size_t num_actions;
  undefined4 in_stack_ffffffffffffff80;
  float in_stack_ffffffffffffff88;
  float fVar4;
  float local_6c;
  score_iterator local_50;
  score_iterator local_40;
  float local_2c;
  size_t local_28;
  score_iterator *local_20;
  score_iterator *local_18;
  uint local_10;
  float local_c;
  int local_4;
  
  local_20 = param_4;
  local_18 = param_3;
  local_10 = param_2;
  local_c = param_1;
  bVar1 = ACTION_SCORE::score_iterator::operator<(param_4,param_3);
  if (bVar1) {
    local_4 = 1;
  }
  else {
    local_28 = ACTION_SCORE::score_iterator::operator-(param_4,param_3);
    if (local_28 == 0) {
      local_4 = 1;
    }
    else {
      if (local_28 <= local_10) {
        local_10 = (int)local_28 - 1;
      }
      local_6c = (float)local_28;
      local_2c = local_c / local_6c;
      fVar4 = local_c;
      ACTION_SCORE::score_iterator::score_iterator(&local_40,param_3);
      while (bVar1 = ACTION_SCORE::score_iterator::operator!=(&local_40,param_4), bVar1) {
        in_stack_ffffffffffffff88 = local_2c;
        pfVar2 = ACTION_SCORE::score_iterator::operator*(&local_40);
        *pfVar2 = in_stack_ffffffffffffff88;
        ACTION_SCORE::score_iterator::operator++(&local_40);
      }
      fVar3 = 1.0 - local_c;
      ACTION_SCORE::score_iterator::operator+
                ((score_iterator *)CONCAT44(fVar4,in_stack_ffffffffffffff88),
                 CONCAT44(fVar3,in_stack_ffffffffffffff80));
      pfVar2 = ACTION_SCORE::score_iterator::operator*(&local_50);
      *pfVar2 = fVar3 + *pfVar2;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int generate_epsilon_greedy(float epsilon, uint32_t top_action, It pdf_first, It pdf_last, std::random_access_iterator_tag /* pdf_tag */)
  {
    if (pdf_last < pdf_first)
      return E_EXPLORATION_BAD_RANGE;

    size_t num_actions = pdf_last - pdf_first;
    if (num_actions == 0)
      return E_EXPLORATION_BAD_RANGE;

	if (top_action >= num_actions)
  	  top_action = (uint32_t)num_actions - 1;

    float prob = epsilon / (float)num_actions;

    for (It d = pdf_first; d != pdf_last; ++d)
      *d = prob;

    *(pdf_first + top_action) += 1.f - epsilon;

    return S_EXPLORATION_OK;
  }